

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int ctr_drbg_update_internal(mbedtls_ctr_drbg_context *ctx,uchar *data)

{
  uchar uVar1;
  int local_5c;
  int local_58;
  int ret;
  int j;
  int i;
  uchar *p;
  uchar tmp [48];
  uchar *data_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  _j = &p;
  tmp._40_8_ = data;
  memset(&p,0,0x30);
  for (local_58 = 0; local_58 < 0x30; local_58 = local_58 + 0x10) {
    ret = 0x10;
    while ((0 < ret &&
           (uVar1 = ctx->counter[ret + -1] + '\x01', ctx->counter[ret + -1] = uVar1, uVar1 == '\0'))
          ) {
      ret = ret + -1;
    }
    local_5c = mbedtls_aes_crypt_ecb(&ctx->aes_ctx,1,ctx->counter,(uchar *)_j);
    if (local_5c != 0) goto LAB_00154e66;
    _j = _j + 2;
  }
  for (ret = 0; ret < 0x30; ret = ret + 1) {
    tmp[(long)ret + -8] = tmp[(long)ret + -8] ^ *(byte *)(tmp._40_8_ + (long)ret);
  }
  local_5c = mbedtls_aes_setkey_enc(&ctx->aes_ctx,(uchar *)&p,0x100);
  if (local_5c == 0) {
    *(undefined8 *)ctx->counter = tmp._24_8_;
    *(undefined8 *)(ctx->counter + 8) = tmp._32_8_;
  }
LAB_00154e66:
  mbedtls_platform_zeroize(&p,0x30);
  return local_5c;
}

Assistant:

static int ctr_drbg_update_internal( mbedtls_ctr_drbg_context *ctx,
                          const unsigned char data[MBEDTLS_CTR_DRBG_SEEDLEN] )
{
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = tmp;
    int i, j;
    int ret = 0;

    memset( tmp, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        if( ( ret = mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT,
                                           ctx->counter, p ) ) != 0 )
        {
            goto exit;
        }

        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    for( i = 0; i < MBEDTLS_CTR_DRBG_SEEDLEN; i++ )
        tmp[i] ^= data[i];

    /*
     * Update key and counter
     */
    if( ( ret = mbedtls_aes_setkey_enc( &ctx->aes_ctx, tmp,
                                        MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }
    memcpy( ctx->counter, tmp + MBEDTLS_CTR_DRBG_KEYSIZE,
            MBEDTLS_CTR_DRBG_BLOCKSIZE );

exit:
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
    return( ret );
}